

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleGetRuntimeDependenciesCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  _Rb_tree_node_base *__x;
  _Base_ptr *__last;
  _Rb_tree_node_base *__x_00;
  cmMakefile *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  Mode MVar7;
  int iVar8;
  string *psVar9;
  size_type sVar10;
  cmState *this_00;
  ostream *poVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *pmVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar15;
  long lVar16;
  pointer pbVar17;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  string_view arg;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  string pathsStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unresolvedDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflictingDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValues;
  ostringstream e;
  string local_468 [32];
  string local_448 [320];
  string platform;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  string local_2d0;
  Arguments parsedArgs;
  cmRuntimeDependencyArchive archive;
  
  if (HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::supportedPlatforms_abi_cxx11_ == '\0') {
    iVar8 = __cxa_guard_acquire(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::supportedPlatforms_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"Windows",(allocator<char> *)&parsedArgs);
      std::__cxx11::string::string<std::allocator<char>>
                (local_468,"Linux",(allocator<char> *)&archive);
      std::__cxx11::string::string<std::allocator<char>>
                (local_448,"Darwin",(allocator<char> *)&platform);
      __l._M_len = 3;
      __l._M_array = (iterator)&e;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::supportedPlatforms_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pathsStr,(allocator_type *)&unrecognizedArguments);
      lVar16 = 0x40;
      do {
        std::__cxx11::string::~string((string *)(&e + lVar16));
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x20);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::supportedPlatforms_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::supportedPlatforms_abi_cxx11_);
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_HOST_SYSTEM_NAME",(allocator<char> *)&parsedArgs);
  psVar9 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::string((string *)&platform,(string *)psVar9);
  std::__cxx11::string::~string((string *)&e);
  sVar10 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::count(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                    ::supportedPlatforms_abi_cxx11_,&platform);
  if (sVar10 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar11 = std::operator<<((ostream *)&e,"GET_RUNTIME_DEPENDENCIES is not supported on system \""
                             );
    poVar11 = std::operator<<(poVar11,(string *)&platform);
    std::operator<<(poVar11,"\"");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&parsedArgs.ResolvedDependenciesVar);
    std::__cxx11::string::~string((string *)&parsedArgs);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar6 = false;
    goto LAB_00180557;
  }
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  MVar7 = cmState::GetMode(this_00);
  if (MVar7 == Project) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "You have used file(GET_RUNTIME_DEPENDENCIES) in project mode. This is probably not what you intended to do. Instead, please consider using it in an install(CODE) or install(SCRIPT) command. For example:\n  install(CODE [[\n    file(GET_RUNTIME_DEPENDENCIES\n      # ...\n      )\n    ]])"
               ,(allocator<char> *)&parsedArgs);
    cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  if (HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::parser == '\0') {
    iVar8 = __cxa_guard_acquire(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::parser);
    if (iVar8 != 0) {
      _e = (cmArgumentParser<Arguments> *)0x0;
      name.super_string_view._M_str = "RESOLVED_DEPENDENCIES_VAR";
      name.super_string_view._M_len = 0x19;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name,0);
      name_00.super_string_view._M_str = "UNRESOLVED_DEPENDENCIES_VAR";
      name_00.super_string_view._M_len = 0x1b;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_00,0x20);
      name_01.super_string_view._M_str = "CONFLICTING_DEPENDENCIES_PREFIX";
      name_01.super_string_view._M_len = 0x1f;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_01,0x40);
      name_02.super_string_view._M_str = "BUNDLE_EXECUTABLE";
      name_02.super_string_view._M_len = 0x11;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_02,0x60);
      name_03.super_string_view._M_str = "EXECUTABLES";
      name_03.super_string_view._M_len = 0xb;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_03,0x80);
      name_04.super_string_view._M_str = "LIBRARIES";
      name_04.super_string_view._M_len = 9;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_04,0x98);
      name_05.super_string_view._M_str = "MODULES";
      name_05.super_string_view._M_len = 7;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_05,200);
      name_06.super_string_view._M_str = "DIRECTORIES";
      name_06.super_string_view._M_len = 0xb;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_06,0xb0);
      name_07.super_string_view._M_str = "PRE_INCLUDE_REGEXES";
      name_07.super_string_view._M_len = 0x13;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_07,0xe0);
      name_08.super_string_view._M_str = "PRE_EXCLUDE_REGEXES";
      name_08.super_string_view._M_len = 0x13;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_08,0xf8);
      name_09.super_string_view._M_str = "POST_INCLUDE_REGEXES";
      name_09.super_string_view._M_len = 0x14;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_09,0x110);
      name_10.super_string_view._M_str = "POST_EXCLUDE_REGEXES";
      name_10.super_string_view._M_len = 0x14;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_10,0x128);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)&HandleGetRuntimeDependenciesCommand::parser,
               (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)&e);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                 *)&e);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,
                   &HandleGetRuntimeDependenciesCommand::parser,&__dso_handle);
      __cxa_guard_release(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::parser);
    }
  }
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keywordsMissingValues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keywordsMissingValues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keywordsMissingValues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  parsedArgs.ResolvedDependenciesVar._M_dataplus._M_p =
       (pointer)&parsedArgs.ResolvedDependenciesVar.field_2;
  parsedArgs.ResolvedDependenciesVar._M_string_length = 0;
  parsedArgs.ResolvedDependenciesVar.field_2._M_local_buf[0] = '\0';
  parsedArgs.UnresolvedDependenciesVar._M_dataplus._M_p =
       (pointer)&parsedArgs.UnresolvedDependenciesVar.field_2;
  parsedArgs.UnresolvedDependenciesVar._M_string_length = 0;
  parsedArgs.UnresolvedDependenciesVar.field_2._M_local_buf[0] = '\0';
  parsedArgs.ConflictingDependenciesPrefix._M_dataplus._M_p =
       (pointer)&parsedArgs.ConflictingDependenciesPrefix.field_2;
  parsedArgs.ConflictingDependenciesPrefix._M_string_length = 0;
  parsedArgs.ConflictingDependenciesPrefix.field_2._M_local_buf[0] = '\0';
  parsedArgs.BundleExecutable._M_dataplus._M_p = (pointer)&parsedArgs.BundleExecutable.field_2;
  parsedArgs.BundleExecutable._M_string_length = 0;
  parsedArgs.BundleExecutable.field_2._M_local_buf[0] = '\0';
  memset(&parsedArgs.Executables,0,0xc0);
  _e = &HandleGetRuntimeDependenciesCommand::parser;
  while (pbVar5 = keywordsMissingValues.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pbVar4 = unrecognizedArguments.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, pbVar17 = pbVar2 + 1, pbVar17 != pbVar3)
  {
    arg._M_str = (pbVar17->_M_dataplus)._M_p;
    arg._M_len = pbVar2[1]._M_string_length;
    ArgumentParser::Instance::Consume
              ((Instance *)&e,arg,&parsedArgs,&unrecognizedArguments,&keywordsMissingValues);
    pbVar2 = pbVar17;
  }
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (keywordsMissingValues.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        keywordsMissingValues.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar11 = std::operator<<((ostream *)&e,"Keyword missing value: ");
      std::operator<<(poVar11,(string *)pbVar5);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&archive);
      goto LAB_0018050a;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2e8,&parsedArgs.Directories);
    std::__cxx11::string::string((string *)&local_2d0,(string *)&parsedArgs.BundleExecutable);
    cmRuntimeDependencyArchive::cmRuntimeDependencyArchive
              (&archive,&this->super_cmCommand,&local_2e8,&local_2d0,&parsedArgs.PreIncludeRegexes,
               &parsedArgs.PreExcludeRegexes,&parsedArgs.PostIncludeRegexes,
               &parsedArgs.PostExcludeRegexes);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e8);
    bVar6 = cmRuntimeDependencyArchive::Prepare(&archive);
    if (bVar6) {
      bVar6 = cmRuntimeDependencyArchive::GetRuntimeDependencies
                        (&archive,&parsedArgs.Executables,&parsedArgs.Libraries,&parsedArgs.Modules)
      ;
      if (!bVar6) goto LAB_001807b8;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unresolvedDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unresolvedDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unresolvedDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      conflictingDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      conflictingDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      conflictingDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pmVar12 = cmRuntimeDependencyArchive::GetResolvedPaths_abi_cxx11_(&archive);
      for (p_Var14 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var14 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
        p_Var13 = p_Var14[2]._M_right;
        __last = &p_Var14[2]._M_parent;
        if (p_Var13 == (_Rb_tree_node_base *)__last) {
          __assert_fail("it != val.second.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                        ,0xaf5,
                        "bool cmFileCommand::HandleGetRuntimeDependenciesCommand(const std::vector<std::string> &)"
                       );
        }
        __x_00 = p_Var14 + 1;
        __x = p_Var13 + 1;
        do {
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
          if (p_Var13 == (_Rb_tree_node_base *)__last) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&deps,(value_type *)__x);
            goto LAB_001807a8;
          }
          bVar6 = cmsys::SystemTools::SameFile((string *)__x,(string *)(p_Var13 + 1));
        } while (bVar6);
        if (parsedArgs.ConflictingDependenciesPrefix._M_string_length == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar11 = std::operator<<((ostream *)&e,"Multiple conflicting paths found for ");
          poVar11 = std::operator<<(poVar11,(string *)__x_00);
          std::operator<<(poVar11,":");
          for (p_Var14 = p_Var14[2]._M_right; p_Var14 != (_Base_ptr)__last;
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
            poVar11 = std::operator<<((ostream *)&e,"\n  ");
            std::operator<<(poVar11,(string *)(p_Var14 + 1));
          }
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&pathsStr);
          goto LAB_00180a5c;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&conflictingDeps,(value_type *)__x_00);
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
                   (const_iterator)0x0,p_Var14[2]._M_right,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )__last);
        std::operator+(&pathsStr,&parsedArgs.ConflictingDependenciesPrefix,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       &pathsStr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x_00);
        std::__cxx11::string::~string((string *)&pathsStr);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&pathsStr,&paths,";");
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,(string *)&e,pathsStr._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&pathsStr);
        std::__cxx11::string::~string((string *)&e);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&paths);
LAB_001807a8:
      }
      psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
      pbVar2 = unresolvedDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((psVar15->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00180826:
        if (parsedArgs.ResolvedDependenciesVar._M_string_length != 0) {
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&e,&deps,";");
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&parsedArgs.ResolvedDependenciesVar,(char *)_e
                    );
          std::__cxx11::string::~string((string *)&e);
        }
        if (parsedArgs.UnresolvedDependenciesVar._M_string_length != 0) {
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&e,&unresolvedDeps,";");
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&parsedArgs.UnresolvedDependenciesVar,
                     (char *)_e);
          std::__cxx11::string::~string((string *)&e);
        }
        bVar6 = true;
        if (parsedArgs.ConflictingDependenciesPrefix._M_string_length != 0) {
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&e,&conflictingDeps,";");
          pcVar1 = (this->super_cmCommand).Makefile;
          std::operator+(&pathsStr,&parsedArgs.ConflictingDependenciesPrefix,"_FILENAMES");
          cmMakefile::AddDefinition(pcVar1,&pathsStr,(char *)_e);
          std::__cxx11::string::~string((string *)&pathsStr);
          std::__cxx11::string::~string((string *)&e);
        }
      }
      else {
        if (parsedArgs.UnresolvedDependenciesVar._M_string_length != 0) {
          psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
          __first._M_node = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &unresolvedDeps,(const_iterator)pbVar2,__first,
                     (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )&(psVar15->_M_t)._M_impl.super__Rb_tree_header);
          goto LAB_00180826;
        }
        psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
        p_Var14 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
        if ((_Rb_tree_header *)p_Var14 == &(psVar15->_M_t)._M_impl.super__Rb_tree_header) {
          __assert_fail("it != archive.GetUnresolvedPaths().end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                        ,0xb1a,
                        "bool cmFileCommand::HandleGetRuntimeDependenciesCommand(const std::vector<std::string> &)"
                       );
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar11 = std::operator<<((ostream *)&e,"Could not resolve file ");
        std::operator<<(poVar11,(string *)(p_Var14 + 1));
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&pathsStr);
LAB_00180a5c:
        std::__cxx11::string::~string((string *)&pathsStr);
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar6 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&conflictingDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&unresolvedDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deps);
    }
    else {
LAB_001807b8:
      cmSystemTools::s_FatalErrorOccured = true;
      bVar6 = false;
    }
    cmRuntimeDependencyArchive::~cmRuntimeDependencyArchive(&archive);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar11 = std::operator<<((ostream *)&e,"Unrecognized argument: \"");
    poVar11 = std::operator<<(poVar11,(string *)pbVar4);
    std::operator<<(poVar11,"\"");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&archive);
LAB_0018050a:
    std::__cxx11::string::~string((string *)&archive);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar6 = false;
  }
  HandleGetRuntimeDependenciesCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keywordsMissingValues);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
LAB_00180557:
  std::__cxx11::string::~string((string *)&platform);
  return bVar6;
}

Assistant:

bool cmFileCommand::HandleGetRuntimeDependenciesCommand(
  std::vector<std::string> const& args)
{
  static const std::set<std::string> supportedPlatforms = { "Windows", "Linux",
                                                            "Darwin" };
  std::string platform =
    this->Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  if (!supportedPlatforms.count(platform)) {
    std::ostringstream e;
    e << "GET_RUNTIME_DEPENDENCIES is not supported on system \"" << platform
      << "\"";
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (this->Makefile->GetState()->GetMode() == cmState::Project) {
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING,
                                 "You have used file(GET_RUNTIME_DEPENDENCIES)"
                                 " in project mode. This is probably not what "
                                 "you intended to do. Instead, please consider"
                                 " using it in an install(CODE) or "
                                 "install(SCRIPT) command. For example:"
                                 "\n  install(CODE [["
                                 "\n    file(GET_RUNTIME_DEPENDENCIES"
                                 "\n      # ..."
                                 "\n      )"
                                 "\n    ]])");
  }

  struct Arguments
  {
    std::string ResolvedDependenciesVar;
    std::string UnresolvedDependenciesVar;
    std::string ConflictingDependenciesPrefix;
    std::string BundleExecutable;
    std::vector<std::string> Executables;
    std::vector<std::string> Libraries;
    std::vector<std::string> Directories;
    std::vector<std::string> Modules;
    std::vector<std::string> PreIncludeRegexes;
    std::vector<std::string> PreExcludeRegexes;
    std::vector<std::string> PostIncludeRegexes;
    std::vector<std::string> PostExcludeRegexes;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESOLVED_DEPENDENCIES_VAR"_s, &Arguments::ResolvedDependenciesVar)
      .Bind("UNRESOLVED_DEPENDENCIES_VAR"_s,
            &Arguments::UnresolvedDependenciesVar)
      .Bind("CONFLICTING_DEPENDENCIES_PREFIX"_s,
            &Arguments::ConflictingDependenciesPrefix)
      .Bind("BUNDLE_EXECUTABLE"_s, &Arguments::BundleExecutable)
      .Bind("EXECUTABLES"_s, &Arguments::Executables)
      .Bind("LIBRARIES"_s, &Arguments::Libraries)
      .Bind("MODULES"_s, &Arguments::Modules)
      .Bind("DIRECTORIES"_s, &Arguments::Directories)
      .Bind("PRE_INCLUDE_REGEXES"_s, &Arguments::PreIncludeRegexes)
      .Bind("PRE_EXCLUDE_REGEXES"_s, &Arguments::PreExcludeRegexes)
      .Bind("POST_INCLUDE_REGEXES"_s, &Arguments::PostIncludeRegexes)
      .Bind("POST_EXCLUDE_REGEXES"_s, &Arguments::PostExcludeRegexes);

  std::vector<std::string> unrecognizedArguments;
  std::vector<std::string> keywordsMissingValues;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments,
                 &keywordsMissingValues);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    std::ostringstream e;
    e << "Unrecognized argument: \"" << *argIt << "\"";
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  argIt = keywordsMissingValues.begin();
  if (argIt != keywordsMissingValues.end()) {
    std::ostringstream e;
    e << "Keyword missing value: " << *argIt;
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  cmRuntimeDependencyArchive archive(
    this, parsedArgs.Directories, parsedArgs.BundleExecutable,
    parsedArgs.PreIncludeRegexes, parsedArgs.PreExcludeRegexes,
    parsedArgs.PostIncludeRegexes, parsedArgs.PostExcludeRegexes);
  if (!archive.Prepare()) {
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (!archive.GetRuntimeDependencies(
        parsedArgs.Executables, parsedArgs.Libraries, parsedArgs.Modules)) {
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  std::vector<std::string> deps, unresolvedDeps, conflictingDeps;
  for (auto const& val : archive.GetResolvedPaths()) {
    bool unique = true;
    auto it = val.second.begin();
    assert(it != val.second.end());
    auto const& firstPath = *it;
    while (++it != val.second.end()) {
      if (!cmSystemTools::SameFile(firstPath, *it)) {
        unique = false;
        break;
      }
    }

    if (unique) {
      deps.push_back(firstPath);
    } else if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
      conflictingDeps.push_back(val.first);
      std::vector<std::string> paths;
      paths.insert(paths.begin(), val.second.begin(), val.second.end());
      std::string varName =
        parsedArgs.ConflictingDependenciesPrefix + "_" + val.first;
      std::string pathsStr = cmJoin(paths, ";");
      this->Makefile->AddDefinition(varName, pathsStr.c_str());
    } else {
      std::ostringstream e;
      e << "Multiple conflicting paths found for " << val.first << ":";
      for (auto const& path : val.second) {
        e << "\n  " << path;
      }
      this->SetError(e.str());
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
  }
  if (!archive.GetUnresolvedPaths().empty()) {
    if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
      unresolvedDeps.insert(unresolvedDeps.begin(),
                            archive.GetUnresolvedPaths().begin(),
                            archive.GetUnresolvedPaths().end());
    } else {
      auto it = archive.GetUnresolvedPaths().begin();
      assert(it != archive.GetUnresolvedPaths().end());
      std::ostringstream e;
      e << "Could not resolve file " << *it;
      this->SetError(e.str());
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
  }

  if (!parsedArgs.ResolvedDependenciesVar.empty()) {
    std::string val = cmJoin(deps, ";");
    this->Makefile->AddDefinition(parsedArgs.ResolvedDependenciesVar,
                                  val.c_str());
  }
  if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
    std::string val = cmJoin(unresolvedDeps, ";");
    this->Makefile->AddDefinition(parsedArgs.UnresolvedDependenciesVar,
                                  val.c_str());
  }
  if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
    std::string val = cmJoin(conflictingDeps, ";");
    this->Makefile->AddDefinition(
      parsedArgs.ConflictingDependenciesPrefix + "_FILENAMES", val.c_str());
  }
  return true;
}